

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::DescriptorChecksum_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Span<const_char> *span)

{
  int j;
  size_type sVar1;
  uint64_t c;
  long lVar2;
  long lVar3;
  int iVar4;
  int val;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                 INPUT_CHARSET_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_,
                 "0123456789()[],\'/*abcdefgh@:$%{}IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~ijklmnopqrstuvwxyzABCDEFGH`#\"\\ "
                 ,&local_39);
      __cxa_atexit(std::__cxx11::string::~string,
                   &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                           INPUT_CHARSET_abi_cxx11_);
    }
  }
  if (DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                 CHECKSUM_CHARSET_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_
                 ,"qpzry9x8gf2tvdw0s3jn54khce6mua7l",&local_3a);
      __cxa_atexit(std::__cxx11::string::~string,
                   &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                    CHECKSUM_CHARSET_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                           CHECKSUM_CHARSET_abi_cxx11_);
    }
  }
  lVar3 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  c = 1;
  lVar5 = 0;
  iVar4 = 0;
  val = 0;
  do {
    if (lVar2 == lVar5) {
      if (0 < iVar4) {
        c = anon_unknown.dwarf_20069f2::PolyMod(c,val);
      }
      iVar4 = 8;
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        c = anon_unknown.dwarf_20069f2::PolyMod(c,0);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x2020202020202020;
      __return_storage_ptr__->_M_string_length = 8;
      (__return_storage_ptr__->field_2)._M_local_buf[8] = '\0';
      lVar2 = 0;
      for (lVar3 = 0x23; lVar3 != -5; lVar3 = lVar3 + -5) {
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar2] =
             DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_.
             _M_dataplus._M_p[(uint)((c ^ 1) >> ((byte)lVar3 & 0x3f)) & 0x1f];
        lVar2 = lVar2 + 1;
      }
LAB_005c24ac:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                        INPUT_CHARSET_abi_cxx11_,*(char *)(lVar3 + lVar5),0);
    if (sVar1 == 0xffffffffffffffff) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_3b);
      goto LAB_005c24ac;
    }
    c = anon_unknown.dwarf_20069f2::PolyMod(c,(uint)sVar1 & 0x1f);
    val = (int)(sVar1 >> 5) + val * 3;
    iVar4 = iVar4 + 1;
    if (iVar4 == 3) {
      c = anon_unknown.dwarf_20069f2::PolyMod(c,val);
      iVar4 = 0;
      val = 0;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

std::string DescriptorChecksum(const Span<const char>& span)
{
    /** A character set designed such that:
     *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
     *  - Case errors cause an offset that's a multiple of 32.
     *  - As many alphabetic characters are in the same group (while following the above restrictions).
     *
     * If p(x) gives the position of a character c in this character set, every group of 3 characters
     * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
     * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
     * affect a single symbol.
     *
     * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
     * the position within the groups.
     */
    static const std::string INPUT_CHARSET =
        "0123456789()[],'/*abcdefgh@:$%{}"
        "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
        "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

    /** The character set for the checksum itself (same as bech32). */
    static const std::string CHECKSUM_CHARSET = "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

    uint64_t c = 1;
    int cls = 0;
    int clscount = 0;
    for (auto ch : span) {
        auto pos = INPUT_CHARSET.find(ch);
        if (pos == std::string::npos) return "";
        c = PolyMod(c, pos & 31); // Emit a symbol for the position inside the group, for every character.
        cls = cls * 3 + (pos >> 5); // Accumulate the group numbers
        if (++clscount == 3) {
            // Emit an extra symbol representing the group numbers, for every 3 characters.
            c = PolyMod(c, cls);
            cls = 0;
            clscount = 0;
        }
    }
    if (clscount > 0) c = PolyMod(c, cls);
    for (int j = 0; j < 8; ++j) c = PolyMod(c, 0); // Shift further to determine the checksum.
    c ^= 1; // Prevent appending zeroes from not affecting the checksum.

    std::string ret(8, ' ');
    for (int j = 0; j < 8; ++j) ret[j] = CHECKSUM_CHARSET[(c >> (5 * (7 - j))) & 31];
    return ret;
}